

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::trim_expr
          (compiler_type *this,tree_type<cs::token_base_*> *tree,iterator it,trim_type do_trim)

{
  context_t *pcVar1;
  tree_type<cs::token_base_*> *ptVar2;
  _func_int **pp_Var3;
  instance_type *this_00;
  value_type *pvVar4;
  _Elt_pointer ptVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  undefined8 uVar8;
  pointer pbVar9;
  bool bVar10;
  __type _Var11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  token_base **pptVar15;
  token_base *ptVar16;
  token_id *this_01;
  undefined4 extraout_var;
  iterator iVar17;
  token_parallel *this_02;
  undefined4 extraout_var_00;
  statement_return *this_03;
  undefined4 extraout_var_01;
  token_base *ptVar18;
  token_vargs *this_04;
  object_method *this_05;
  token_value *ptVar19;
  internal_error *this_06;
  runtime_error *this_07;
  compile_error *pcVar20;
  tree_type<cs::token_base_*> *ptVar21;
  string *name;
  iterator size;
  function *pfVar22;
  context_t *size_00;
  tree_type<cs::token_base_*> *tree_2;
  size_t sVar23;
  value_type *__x;
  _Map_pointer pptVar24;
  tree_type<cs::token_base_*> *tree_1;
  tree_type<cs::token_base_*> *tree_00;
  _func_int **pp_Var25;
  function *__lhs;
  value_type *pvVar26;
  _Elt_pointer ptVar27;
  tree_type<cs::token_base_*> *lst;
  _Elt_pointer tree_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<cs::tree_type<cs::token_base_*>_> __l_00;
  initializer_list<cs::statement_base_*> __l_01;
  undefined4 uVar28;
  iterator it_local;
  var lambda;
  _Alloc_hider local_290;
  string decl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  any local_238;
  function func;
  any local_170;
  tree_type<cs::token_base_*> local_168;
  size_t local_160;
  tree_type<cs::token_base_*> local_158;
  token_base *token;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  string local_110;
  string local_f0;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_d0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> local_80
  ;
  
  if (it.mData == (tree_node *)0x0) {
    return;
  }
  ptVar21 = tree;
  it_local = it;
  pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  ptVar16 = *pptVar15;
  if (ptVar16 == (token_base *)0x0) {
    return;
  }
  token = ptVar16;
  iVar14 = (*ptVar16->_vptr_token_base[2])(ptVar16);
  if (iVar14 != 3) {
    if (iVar14 == 0xe) {
      tree_00 = (tree_type<cs::token_base_*> *)ptVar16[2]._vptr_token_base;
      ptVar21 = (tree_type<cs::token_base_*> *)ptVar16[3]._vptr_token_base;
      sVar23 = ptVar16[3].line_num;
      ptVar2 = (tree_type<cs::token_base_*> *)ptVar16[4]._vptr_token_base;
      while (tree_00 != ptVar2) {
        trim_expression(this,tree_00,do_trim);
        tree_00 = tree_00 + 1;
        if (tree_00 == ptVar21) {
          tree_00 = *(tree_type<cs::token_base_*> **)(sVar23 + 8);
          sVar23 = sVar23 + 8;
          ptVar21 = tree_00 + 0x40;
        }
      }
      return;
    }
    if (iVar14 == 0xc) {
      if (do_trim == no_expr_fold) {
        return;
      }
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      ptVar16 = *pptVar15;
      trim_expression(this,(tree_type<cs::token_base_*> *)(ptVar16 + 1),do_trim);
      tree_type<cs::token_base_*>::merge(tree,it_local,(tree_type<cs::token_base_*> *)(ptVar16 + 1))
      ;
      return;
    }
    if (iVar14 == 4) {
      if (do_trim == no_this_deduce) {
        return;
      }
      name = (string *)(ptVar16 + 3);
      bVar10 = domain_manager::exist_record
                         (&(((((this->context).
                               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->instance).
                             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_runtime_type).storage,name);
      if (bVar10) {
        return;
      }
      bVar10 = domain_manager::exist_record_in_struct
                         (&(((((this->context).
                               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->instance).
                             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_runtime_type).storage,name);
      if (!bVar10) {
        return;
      }
      ptVar16 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)name);
      ptVar16->line_num = 1;
      ptVar16->_vptr_token_base = (_func_int **)&PTR__token_base_00248ed0;
      *(undefined4 *)&ptVar16[1]._vptr_token_base = 0xe;
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar15 = ptVar16;
      size = it_local;
      tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
                ((tree_type<cs::token_base*> *)tree,it_local,&token);
      iVar17 = it_local;
      this_01 = (token_id *)token_base::operator_new((token_base *)0x50,(size_t)size.mData);
      std::__cxx11::string::string((string *)&func,"this",(allocator *)&local_258);
      token_id::token_id(this_01,(string *)&func);
      decl._M_dataplus._M_p = (pointer)this_01;
      tree_type<cs::token_base*>::emplace_left_left<cs::token_id*>
                ((tree_type<cs::token_base*> *)tree,iVar17,(token_id **)&decl);
      std::__cxx11::string::~string((string *)&func);
      tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                ((tree_type<cs::token_base*> *)tree,it_local,&token);
      return;
    }
    goto switchD_0012b31d_caseD_f;
  }
  iVar14 = *(int *)&ptVar16[1]._vptr_token_base;
  switch(iVar14) {
  case 0xd:
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar17,no_expr_fold);
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar17,no_expr_fold);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    this_02 = (token_parallel *)*pptVar15;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar16 = *pptVar15;
    if (this_02 == (token_parallel *)0x0 && ptVar16 == (token_base *)0x0) {
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar15 = (token_base *)0x0;
    }
    else {
      if (this_02 == (token_parallel *)0x0) {
        this_02 = (token_parallel *)token_base::operator_new((token_base *)0x60,(size_t)tree);
        (this_02->super_token_base)._vptr_token_base = (_func_int **)0x0;
        (this_02->super_token_base).line_num = 0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size = 0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        (this_02->mTreeList).
        super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
        token_parallel::token_parallel(this_02);
      }
      else {
        iVar14 = (*(this_02->super_token_base)._vptr_token_base[2])(this_02);
        if (iVar14 != 0xf) {
          this_02 = (token_parallel *)token_base::operator_new((token_base *)0x60,(size_t)tree);
          iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
          iVar14 = tree_type<cs::token_base_*>::copy
                             ((EVP_PKEY_CTX *)iVar17.mData,(EVP_PKEY_CTX *)0x0);
          func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)CONCAT44(extraout_var_00,iVar14);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&func;
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::deque(&local_80,__l_00,(allocator_type *)&decl);
          token_parallel::token_parallel(this_02,&local_80);
          std::
          deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
          ::~deque(&local_80);
          tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)&func);
        }
      }
      if (ptVar16 != (token_base *)0x0) {
        iVar14 = (*ptVar16->_vptr_token_base[2])(ptVar16);
        if (iVar14 == 0xf) {
          __x = (value_type *)ptVar16[2]._vptr_token_base;
          pvVar26 = (value_type *)ptVar16[3]._vptr_token_base;
          sVar23 = ptVar16[3].line_num;
          pvVar4 = (value_type *)ptVar16[4]._vptr_token_base;
          while (__x != pvVar4) {
            std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::push_back(&this_02->mTreeList,__x);
            __x = __x + 1;
            if (__x == pvVar26) {
              __x = *(value_type **)(sVar23 + 8);
              sVar23 = sVar23 + 8;
              pvVar26 = __x + 0x40;
            }
          }
        }
        else {
          func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
          std::deque<cs::tree_type<cs::token_base*>,std::allocator<cs::tree_type<cs::token_base*>>>
          ::emplace_back<cs::tree_type<cs::token_base*>::iterator>
                    ((deque<cs::tree_type<cs::token_base*>,std::allocator<cs::tree_type<cs::token_base*>>>
                      *)&this_02->mTreeList,(iterator *)&func);
        }
      }
      tree_01 = (this_02->mTreeList).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      ptVar27 = (this_02->mTreeList).
                super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      pptVar24 = (this_02->mTreeList).
                 super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      ptVar5 = (this_02->mTreeList).
               super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (tree_01 != ptVar5) {
        trim_expr(this,tree_01,tree_01->mRoot,do_trim);
        tree_01 = tree_01 + 1;
        if (tree_01 == ptVar27) {
          tree_01 = pptVar24[1];
          pptVar24 = pptVar24 + 1;
          ptVar27 = tree_01 + 0x40;
        }
      }
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar15 = &this_02->super_token_base;
    }
    break;
  case 0xe:
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar17,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if ((*pptVar15 == (token_base *)0x0) ||
       (iVar14 = (*(*pptVar15)->_vptr_token_base[2])(), iVar14 != 4)) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for dot expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x28:
  case 0x2f:
  case 0x30:
    goto switchD_0012b31d_caseD_f;
  case 0x11:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 == (token_base *)0x0) {
LAB_0012c636:
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for assign expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    decl._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&decl);
    if (*pptVar15 == (token_base *)0x0) goto LAB_0012c636;
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    ptVar21 = tree;
    trim_expr(this,tree,iVar17,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    iVar14 = (*(*pptVar15)->_vptr_token_base[2])();
    if (iVar14 == 0xf) {
      ptVar16 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar21);
      ptVar16->line_num = 1;
      ptVar16->_vptr_token_base = (_func_int **)&PTR__token_base_00248ed0;
      *(undefined4 *)&ptVar16[1]._vptr_token_base = 0x35;
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar15 = ptVar16;
    }
    goto LAB_0012bb9d;
  case 0x19:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 != (token_base *)0x0) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for not expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto switchD_0012b31d_caseD_f;
  case 0x1d:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar16 = *pptVar15;
    if (((ptVar16 == (token_base *)0x0) ||
        (ptVar16->_vptr_token_base != (_func_int **)&PTR__token_base_00248ed0)) ||
       (*(int *)&ptVar16[1]._vptr_token_base != 0x1c)) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for choice expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar17,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    iVar17 = tree_type<cs::token_base_*>::iterator::left((iterator *)&func);
    trim_expr(this,tree,iVar17,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pfVar22 = &func;
    goto LAB_0012bf01;
  case 0x25:
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar17,do_trim);
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar17,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar16 = *pptVar15;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (((this->inside_lambda != true) || (ptVar16 != (token_base *)0x0)) ||
       ((ptVar16 = *pptVar15, ptVar16 == (token_base *)0x0 ||
        (iVar14 = (*ptVar16->_vptr_token_base[2])(ptVar16), iVar14 != 0xd)))) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for lambda expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto LAB_0012bd9f;
  case 0x27:
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar17,do_trim);
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar17,do_trim);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar16 = *pptVar15;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (((ptVar16 == (token_base *)0x0) || (*pptVar15 == (token_base *)0x0)) ||
       (iVar14 = (*(*pptVar15)->_vptr_token_base[2])(), iVar14 != 0xd)) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong syntax for function call.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x29:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 != (token_base *)0x0) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for typeid expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto switchD_0012b31d_caseD_f;
  case 0x2a:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 != (token_base *)0x0) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for addr expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto switchD_0012b31d_caseD_f;
  case 0x2b:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 != (token_base *)0x0) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for new expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto switchD_0012b31d_caseD_f;
  case 0x2c:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 != (token_base *)0x0) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for gcnew expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
LAB_0012bb9d:
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    goto LAB_0012bf09;
  case 0x2d:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 == (token_base *)0x0) {
LAB_0012c5a4:
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for arrow expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    decl._M_dataplus._M_p = (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&decl);
    if (*pptVar15 == (token_base *)0x0) goto LAB_0012c5a4;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_258);
    iVar14 = (*(*pptVar15)->_vptr_token_base[2])();
    if (iVar14 != 4) goto LAB_0012c5a4;
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    goto LAB_0012bf09;
  case 0x2e:
    this->inside_lambda = true;
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar17,do_trim);
    this->inside_lambda = false;
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar18 = *pptVar15;
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar17,no_this_deduce);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (((ptVar18 == (token_base *)0x0) || (*pptVar15 == (token_base *)0x0)) ||
       (iVar14 = (*ptVar18->_vptr_token_base[2])(ptVar18), iVar14 != 0xd)) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for lambda expression.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pp_Var25 = ptVar18[2]._vptr_token_base;
    local_290._M_p = (pointer)ptVar18[3]._vptr_token_base;
    local_160 = ptVar18[3].line_num;
    pp_Var3 = ptVar18[4]._vptr_token_base;
    bVar10 = false;
    while (pp_Var25 != pp_Var3) {
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*pp_Var25;
      pfVar22 = &func;
      pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      if (*pptVar15 == (token_base *)0x0) {
        this_06 = (internal_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&func,"Null pointer accessed.",(allocator *)&decl);
        internal_error::internal_error(this_06,(string *)&func);
        __cxa_throw(this_06,&internal_error::typeinfo,internal_error::~internal_error);
      }
      try_fix_this_deduction((compiler_type *)pfVar22,(tree_node *)*pp_Var25);
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*pp_Var25;
      pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      iVar14 = (*(*pptVar15)->_vptr_token_base[2])();
      if (iVar14 == 4) {
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*pp_Var25;
        pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
        pbVar9 = local_258.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ptVar18 = *pptVar15;
        pfVar22 = (function *)
                  local_258.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while (pfVar22 != (function *)pbVar9) {
          _Var11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pfVar22,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(ptVar18 + 3));
          pfVar22 = (function *)&(pfVar22->mDecl)._M_string_length;
          if (_Var11) {
            pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&func,"Redefinition of function argument.",(allocator *)&decl);
            compile_error::compile_error(pcVar20,(string *)&func);
            __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_258,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ptVar18 + 3));
      }
      else {
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*pp_Var25;
        pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
        iVar14 = (*(*pptVar15)->_vptr_token_base[2])();
        if (iVar14 != 5) {
          pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&func,"Unexpected element in function argument list.",
                     (allocator *)&decl);
          compile_error::compile_error(pcVar20,(string *)&func);
          __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
        }
        func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*pp_Var25;
        pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
        if (local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_258.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&func,"Redefinition of function argument(Multi-define of vargs).",
                     (allocator *)&decl);
          compile_error::compile_error(pcVar20,(string *)&func);
          __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
        }
        bVar10 = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_258,(value_type *)(*pptVar15 + 1));
      }
      pp_Var25 = pp_Var25 + 1;
      if (pp_Var25 == (_func_int **)local_290._M_p) {
        pp_Var25 = *(_func_int ***)(local_160 + 8);
        local_160 = local_160 + 8;
        local_290._M_p = (pointer)(pp_Var25 + 0x40);
      }
    }
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    std::__cxx11::string::string((string *)&func,"self",(allocator *)&decl);
    pfVar22 = &func;
    bVar12 = find_id_ref(iVar17,(string *)pfVar22);
    std::__cxx11::string::~string((string *)&func);
    if ((~bVar12 & 1U) == 0 && bVar10 == false) {
      std::__cxx11::string::string((string *)&func,"self",(allocator *)&lambda);
      __l._M_len = 1;
      __l._M_array = (iterator)&func;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&decl,__l,(allocator_type *)&local_238);
      std::__cxx11::string::~string((string *)&func);
      pfVar22 = (function *)
                ((long)local_258.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_258.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&decl,(size_type)pfVar22);
      pbVar9 = local_258.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__lhs = (function *)
                   local_258.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = decl.field_2._M_allocated_capacity, sVar7 = decl._M_string_length,
          _Var6._M_p = decl._M_dataplus._M_p, __lhs != (function *)pbVar9;
          __lhs = (function *)&(__lhs->mDecl)._M_string_length) {
        bVar13 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__lhs,"self");
        if (!bVar13) {
          this_07 = (runtime_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&func,"Overwrite the default argument \"self\".",(allocator *)&lambda
                    );
          runtime_error::runtime_error(this_07,(string *)&func);
          __cxa_throw(this_07,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        pfVar22 = __lhs;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&decl,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      }
      decl.field_2._M_allocated_capacity =
           (size_type)
           local_258.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      decl._M_dataplus._M_p =
           (pointer)local_258.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      decl._M_string_length =
           (size_type)
           local_258.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var6._M_p;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar7;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&decl);
    }
    this_03 = (statement_return *)
              statement_base::operator_new((statement_base *)0x28,(size_t)pfVar22);
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    iVar14 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar17.mData,(EVP_PKEY_CTX *)0x0);
    local_168.mRoot = (tree_node *)CONCAT44(extraout_var_01,iVar14);
    pcVar1 = &this->context;
    size_00 = pcVar1;
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_138,&pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
    ;
    ptVar18 = (token_base *)token_base::operator_new((token_base *)0x10,(size_t)size_00);
    ptVar18->line_num = ptVar16->line_num;
    ptVar18->_vptr_token_base = (_func_int **)&PTR__token_base_002494d8;
    statement_return::statement_return(this_03,&local_168,(context_t *)&local_138,ptVar18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    tree_type<cs::token_base_*>::~tree_type(&local_168);
    std::__cxx11::string::string((string *)&decl,"function [lambda](",(allocator *)&func);
    pbVar9 = local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_258.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::append((char *)&decl);
    }
    else {
      for (pfVar22 = (function *)
                     local_258.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pfVar22 != (function *)pbVar9;
          pfVar22 = (function *)&(pfVar22->mDecl)._M_string_length) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pfVar22,
                       ", ");
        std::__cxx11::string::append((string *)&decl);
        std::__cxx11::string::~string((string *)&func);
      }
      std::__cxx11::string::pop_back();
      decl._M_dataplus._M_p[decl._M_string_length - 1] = ')';
    }
    std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_148,&pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__cxx11::string::string((string *)&local_110,(string *)&decl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_128,&local_258);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&lambda;
    lambda.mDat = (proxy *)this_03;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d0,
               __l_01,(allocator_type *)&local_238);
    cs::function::function
              (&func,(context_t *)&local_148,&local_110,(statement_base *)this_03,&local_128,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d0,
               bVar10,true);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    std::__cxx11::string::~string((string *)&local_110);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
    if (bVar12) {
      local_238.mDat = (proxy *)0x0;
      cs_impl::any::make_protect<cs::callable,cs::function&>(&local_170,&func);
      cs_impl::any::make<cs::object_method,cs_impl::any,cs_impl::any>(&lambda,&local_238,&local_170)
      ;
      cs_impl::any::recycle(&local_170);
      cs_impl::any::recycle(&local_238);
      this_05 = cs_impl::any::val<cs::object_method>(&lambda);
      cs_impl::any::operator=(&this_05->object,&lambda);
      cs_impl::any::protect(&lambda);
      ptVar19 = new_value(this,&lambda);
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    }
    else {
      cs_impl::any::make_protect<cs::callable,cs::function&>(&lambda,&func);
      ptVar19 = new_value(this,&lambda);
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    }
    *pptVar15 = &ptVar19->super_token_base;
    cs_impl::any::recycle(&lambda);
    cs::function::~function(&func);
    std::__cxx11::string::~string((string *)&decl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_258);
    break;
  case 0x31:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 != (token_base *)0x0) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for variable declaration.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar17,no_this_deduce);
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar16 = *pptVar15;
    if ((ptVar16 == (token_base *)0x0) ||
       (iVar14 = (*ptVar16->_vptr_token_base[2])(ptVar16), iVar14 != 4)) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for variable declaration.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    domain_manager::add_record
              (&(((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage,(string *)(ptVar16 + 3));
    pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    *pptVar15 = ptVar16;
    break;
  case 0x32:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 != (token_base *)0x0) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for variable declaration.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar17,no_this_deduce);
    this_00 = (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    instance_type::check_declar_var(this_00,iVar17,true);
    goto LAB_0012bd84;
  case 0x33:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 != (token_base *)0x0) {
      pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&func,"Wrong grammar for variable declaration.",(allocator *)&decl);
      compile_error::compile_error(pcVar20,(string *)&func);
      __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar17 = tree_type<cs::token_base_*>::iterator::right(&it_local);
    trim_expr(this,tree,iVar17,no_this_deduce);
LAB_0012bd84:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    ptVar16 = *pptVar15;
LAB_0012bd9f:
    pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
    *pptVar15 = ptVar16;
    break;
  case 0x34:
    func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
    pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
    if (*pptVar15 == (token_base *)0x0) {
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
      pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      ptVar16 = *pptVar15;
      if ((ptVar16 == (token_base *)0x0) ||
         (iVar14 = (*ptVar16->_vptr_token_base[2])(ptVar16), iVar14 != 4)) {
        pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&func,"Wrong grammar for vargs expression.",(allocator *)&decl);
        compile_error::compile_error(pcVar20,(string *)&func);
        __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
      }
      this_04 = (token_vargs *)token_base::operator_new((token_base *)0x30,(size_t)ptVar21);
      std::__cxx11::string::string((string *)&local_f0,(string *)(ptVar16 + 3));
      token_vargs::token_vargs(this_04,&local_f0);
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar15 = (token_base *)this_04;
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tree_type<cs::token_base_*>::iterator::right(&it_local);
      pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      if (*pptVar15 != (token_base *)0x0) {
        pcVar20 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&func,"Wrong grammar for vargs expression.",(allocator *)&decl);
        compile_error::compile_error(pcVar20,(string *)&func);
        __cxa_throw(pcVar20,&compile_error::typeinfo,compile_error::~compile_error);
      }
      iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
      trim_expr(this,tree,iVar17,do_trim);
      ptVar16 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)tree);
      iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
      iVar14 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar17.mData,(EVP_PKEY_CTX *)0x0);
      ptVar16->line_num = 1;
      ptVar16->_vptr_token_base = (_func_int **)&PTR__token_expand_00248f58;
      ptVar16[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar14);
      local_158.mRoot = (tree_node *)0x0;
      pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
      *pptVar15 = ptVar16;
      tree_type<cs::token_base_*>::~tree_type(&local_158);
    }
    break;
  default:
    if (iVar14 == 3) {
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      if (*pptVar15 == (token_base *)0x0) {
        uVar28 = 0x30;
LAB_0012beac:
        ptVar16 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar21);
        ptVar16->line_num = 1;
        ptVar16->_vptr_token_base = (_func_int **)&PTR__token_base_00248ed0;
        *(undefined4 *)&ptVar16[1]._vptr_token_base = uVar28;
        pptVar15 = tree_type<cs::token_base_*>::iterator::data(&it_local);
        *pptVar15 = ptVar16;
      }
    }
    else if (iVar14 == 5) {
      func.mContext.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)tree_type<cs::token_base_*>::iterator::left(&it_local);
      pptVar15 = tree_type<cs::token_base_*>::iterator::data((iterator *)&func);
      if (*pptVar15 == (token_base *)0x0) {
        uVar28 = 0x2f;
        goto LAB_0012beac;
      }
    }
switchD_0012b31d_caseD_f:
    pfVar22 = (function *)&it_local;
    iVar17 = tree_type<cs::token_base_*>::iterator::left(&it_local);
    trim_expr(this,tree,iVar17,do_trim);
LAB_0012bf01:
    iVar17 = tree_type<cs::token_base_*>::iterator::right((iterator *)pfVar22);
LAB_0012bf09:
    trim_expr(this,tree,iVar17,do_trim);
  }
  return;
}

Assistant:

void
	compiler_type::trim_expr(tree_type<token_base *> &tree, tree_type<token_base *>::iterator it, trim_type do_trim)
	{
		if (!it.usable())
			return;
		token_base *token = it.data();
		if (token == nullptr)
			return;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id: {
			if (do_trim != trim_type::no_this_deduce) {
				const std::string &id = static_cast<token_id *>(token)->get_id();
				if (!context->instance->storage.exist_record(id) &&
				        context->instance->storage.exist_record_in_struct(id)) {
					it.data() = new token_signal(signal_types::dot_);
					tree.emplace_left_left(it, token);
					tree.emplace_left_left(it, new token_id("this"));
					tree.emplace_right_right(it, token);
				}
			}
			return;
		}
		case token_types::expr: {
			if (do_trim != trim_type::no_expr_fold) {
				tree_type<token_base *> &t = static_cast<token_expr *>(it.data())->get_tree();
				trim_expression(t, do_trim);
				tree.merge(it, t);
			}
			return;
		}
		case token_types::array: {
			for (auto &tree: static_cast<token_array *>(token)->get_array())
				trim_expression(tree, do_trim);
			return;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::addr_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for addr expression.");
				break;
			case signal_types::new_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for new expression.");
				break;
			case signal_types::gcnew_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for gcnew expression.");
				trim_expr(tree, it.right(), do_trim);
				return;
				break;
			case signal_types::typeid_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for typeid expression.");
				break;
			case signal_types::not_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for not expression.");
				break;
			case signal_types::sub_:
				if (it.left().data() == nullptr)
					it.data() = new token_signal(signal_types::minus_);
				break;
			case signal_types::mul_:
				if (it.left().data() == nullptr)
					it.data() = new token_signal(signal_types::escape_);
				break;
			case signal_types::asi_:
				if (it.left().data() == nullptr || it.right().data() == nullptr)
					throw compile_error("Wrong grammar for assign expression.");
				trim_expr(tree, it.left(), do_trim);
				if (it.left().data()->get_type() == token_types::parallel)
					it.data() = new token_signal(signal_types::bind_);
				trim_expr(tree, it.right(), do_trim);
				return;
			case signal_types::com_: {
				trim_expr(tree, it.left(), trim_type::no_expr_fold);
				trim_expr(tree, it.right(), trim_type::no_expr_fold);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr && rptr == nullptr)
					it.data() = nullptr;
				else {
					token_parallel *parallel_list = nullptr;
					if (lptr != nullptr && lptr->get_type() == token_types::parallel)
						parallel_list = static_cast<token_parallel *>(lptr);
					else if (lptr != nullptr)
						parallel_list = new token_parallel({tree_type<token_base *>(it.left())});
					else
						parallel_list = new token_parallel();
					if (rptr != nullptr && rptr->get_type() == token_types::parallel)
						for (auto &tree: static_cast<token_parallel *>(rptr)->get_parallel())
							parallel_list->get_parallel().push_back(tree);
					else if (rptr != nullptr)
						parallel_list->get_parallel().emplace_back(it.right());
					for (auto &lst: parallel_list->get_parallel())
						trim_expr(lst, lst.root(), do_trim);
					it.data() = parallel_list;
				}
				return;
			}
			case signal_types::choice_: {
				token_signal *sig = dynamic_cast<token_signal *>(it.right().data());
				if (sig == nullptr || sig->get_signal() != signal_types::pair_)
					throw compile_error("Wrong grammar for choice expression.");
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right().left(), do_trim);
				trim_expr(tree, it.right().right(), do_trim);
				return;
			}
			case signal_types::vardef_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for variable declaration.");
				context->instance->storage.add_record(static_cast<token_id *>(rptr)->get_id());
				it.data() = rptr;
				return;
			}
			case signal_types::varchk_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				context->instance->check_declar_var(it.right(), true);
				it.data() = it.right().data();
				return;
			}
			case signal_types::varprt_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				it.data() = it.right().data();
				return;
			}
			case signal_types::arrow_:
				if (it.left().data() == nullptr || it.right().data() == nullptr ||
				        it.right().data()->get_type() != token_types::id)
					throw compile_error("Wrong grammar for arrow expression.");
				trim_expr(tree, it.left(), do_trim);
				return;
			case signal_types::dot_: {
				trim_expr(tree, it.left(), do_trim);
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for dot expression.");
				return;
			}
			case signal_types::fcall_: {
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right(), do_trim);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong syntax for function call.");
				return;
			}
			case signal_types::vargs_: {
				if (it.left().data() == nullptr) {
					token_base *rptr = it.right().data();
					if (rptr == nullptr || rptr->get_type() != token_types::id)
						throw compile_error("Wrong grammar for vargs expression.");
					it.data() = new token_vargs(static_cast<token_id *>(rptr)->get_id());
				}
				else {
					if (it.right().data() != nullptr)
						throw compile_error("Wrong grammar for vargs expression.");
					trim_expr(tree, it.left(), do_trim);
					it.data() = new token_expand(tree_type<token_base *>(it.left()));
				}
				return;
			}
			case signal_types::emb_: {
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right(), do_trim);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (!inside_lambda || lptr != nullptr || rptr == nullptr ||
				        rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong grammar for lambda expression.");
				it.data() = rptr;
				return;
			}
			case signal_types::lambda_: {
				inside_lambda = true;
				trim_expr(tree, it.left(), do_trim);
				inside_lambda = false;
				token_base *lptr = it.left().data();
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || lptr->get_type() != token_types::arglist)
					throw compile_error("Wrong grammar for lambda expression.");
				std::vector<std::string> args;
				bool is_vargs = false;
				for (auto &item: static_cast<token_arglist *>(lptr)->get_arglist()) {
					if (item.root().data() == nullptr)
						throw internal_error("Null pointer accessed.");
					try_fix_this_deduction(item.root());
					if (item.root().data()->get_type() == token_types::id) {
						const std::string &str = static_cast<token_id *>(item.root().data())->get_id();
						for (auto &it: args)
							if (it == str)
								throw compile_error("Redefinition of function argument.");
						args.push_back(str);
					}
					else if (item.root().data()->get_type() == token_types::vargs) {
						const std::string &str = static_cast<token_vargs *>(item.root().data())->get_id();
						if (!args.empty())
							throw compile_error("Redefinition of function argument(Multi-define of vargs).");
						args.push_back(str);
						is_vargs = true;
					}
					else
						throw compile_error("Unexpected element in function argument list.");
				}
				bool find_self_ref = find_id_ref(it.right(), "self");
				if (!is_vargs && find_self_ref) {
					std::vector<std::string> new_args{"self"};
					new_args.reserve(args.size());
					for (auto &name: args) {
						if (name != "self")
							new_args.emplace_back(std::move(name));
						else
							throw runtime_error("Overwrite the default argument \"self\".");
					}
					std::swap(new_args, args);
				}
				statement_base *ret = new statement_return(tree_type<token_base *>(it.right()), context,
				        new token_endline(token->get_line_num()));
#ifdef CS_DEBUGGER
				std::string decl="function [lambda](";
				if(args.size()!=0) {
					for(auto& it:args)
						decl+=it+", ";
					decl.pop_back();
					decl[decl.size()-1]=')';
				}
				else
					decl+=")";
				function func(context, decl, ret, args, std::deque<statement_base *> {ret}, is_vargs, true);
#else
				function func(context, args, std::deque<statement_base *> {ret}, is_vargs, true);
#endif
				if (find_self_ref) {
					var lambda = var::make<object_method>(var(), var::make_protect<callable>(func));
					lambda.val<object_method>().object = lambda;
					lambda.protect();
					it.data() = new_value(lambda);
				}
				else
					it.data() = new_value(var::make_protect<callable>(func));
				return;
			}
			}
		}
		}
		trim_expr(tree, it.left(), do_trim);
		trim_expr(tree, it.right(), do_trim);
	}